

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O1

bool loadTopViewProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  size_t sVar3;
  bool bVar4;
  char buf [1024];
  char acStack_428 [8];
  char acStack_420 [8];
  undefined4 uStack_418;
  
  program = (djg_program *)malloc(0x10);
  program->src = (char *)0x0;
  program->next = (djg_program *)0x0;
  fwrite("Loading {Top-View-Program}\n",0x1b,1,_stdout);
  fflush(_stdout);
  if (g_terrain.flags.displace == true) {
    djgp_push_string(program,"#define FLAG_DISPLACE 1\n");
  }
  bVar4 = false;
  djgp_push_string(program,"#define TERRAIN_PATCH_SUBD_LEVEL %i\n",(ulong)(uint)g_terrain.gpuSubd);
  djgp_push_string(program,"#define TERRAIN_PATCH_TESS_FACTOR %i\n",
                   (ulong)(uint)(1 << ((byte)g_terrain.gpuSubd & 0x1f)));
  djgp_push_string(program,"#define BUFFER_BINDING_TERRAIN_VARIABLES %i\n",0);
  djgp_push_string(program,"#define LEB_BUFFER_COUNT 1\n");
  djgp_push_string(program,"#define BUFFER_BINDING_LEB %i\n",0);
  strcpy(acStack_428,g_app.dir.shader);
  sVar3 = strlen(acStack_428);
  *(undefined4 *)((long)&uStack_418 + sVar3) = 0x6c736c;
  builtin_strncpy(acStack_428 + sVar3,"FrustumC",8);
  builtin_strncpy(acStack_420 + sVar3,"ulling.g",8);
  djgp_push_file(program,acStack_428);
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisection.glsl"
                );
  strcpy(acStack_428,g_app.dir.shader);
  sVar3 = strlen(acStack_428);
  builtin_strncpy(acStack_428 + sVar3,"TerrainR",8);
  builtin_strncpy(acStack_420 + sVar3,"enderComm",9);
  builtin_strncpy((char *)((long)&uStack_418 + sVar3 + 1),"on.glsl",8);
  djgp_push_file(program,acStack_428);
  strcpy(acStack_428,g_app.dir.shader);
  sVar3 = strlen(acStack_428);
  *(undefined4 *)((long)&uStack_418 + sVar3) = 0x6c736c;
  builtin_strncpy(acStack_428 + sVar3,"TerrainT",8);
  builtin_strncpy(acStack_420 + sVar3,"opView.g",8);
  djgp_push_file(program,acStack_428);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 4);
  djgp_release(program);
  if (bVar1) {
    g_gl.uniforms[0x1f] = (*glad_glGetUniformLocation)(g_gl.programs[4],"u_DmapFactor");
    g_gl.uniforms[0x1e] = (*glad_glGetUniformLocation)(g_gl.programs[4],"u_DmapSampler");
    (*glad_glProgramUniform1f)(g_gl.programs[4],g_gl.uniforms[0x1f],g_terrain.dmap.scale);
    (*glad_glProgramUniform1i)(g_gl.programs[4],g_gl.uniforms[0x1e],2);
    GVar2 = (*glad_glGetError)();
    bVar4 = GVar2 == 0;
  }
  return bVar4;
}

Assistant:

float computeLodFactor()
{
    if (g_camera.projection == PROJECTION_RECTILINEAR) {
        float tmp = 2.0f * tan(radians(g_camera.fovy) / 2.0f)
            / g_framebuffer.h * (1 << g_terrain.gpuSubd)
            * g_terrain.primitivePixelLengthTarget;

        return -2.0f * std::log2(tmp) + 2.0f;
    } else if (g_camera.projection == PROJECTION_ORTHOGRAPHIC) {
        float planeSize = 2.0f * tan(radians(g_camera.fovy / 2.0f));
        float targetSize = planeSize * g_terrain.primitivePixelLengthTarget
                         / g_framebuffer.h * (1 << g_terrain.gpuSubd);

        return -2.0f * std::log2(targetSize);
    } else if (g_camera.projection == PROJECTION_FISHEYE) {
        return 1.0f;
    }

    return 1.0f;
}